

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O1

void Abc_NtkCutsOracle(Abc_Ntk_t *pNtk,Cut_Oracle_t *p)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  Vec_Int_t *vFanCounts;
  Vec_Ptr_t *pVVar4;
  int *piVar5;
  long lVar6;
  
  iVar3 = Cut_OracleReadDrop(p);
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCut.c"
                  ,0xeb,"void Abc_NtkCutsOracle(Abc_Ntk_t *, Cut_Oracle_t *)");
  }
  if (iVar3 != 0) {
    vFanCounts = Abc_NtkFanoutCounts(pNtk);
    Cut_OracleSetFanoutCounts(p,vFanCounts);
  }
  pVVar4 = pNtk->vCis;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      if (0 < *(int *)((long)pVVar4->pArray[lVar6] + 0x2c)) {
        Cut_OracleNodeSetTriv(p,*(int *)((long)pVVar4->pArray[lVar6] + 0x10));
      }
      lVar6 = lVar6 + 1;
      pVVar4 = pNtk->vCis;
    } while (lVar6 < pVVar4->nSize);
  }
  pVVar4 = Abc_AigDfs(pNtk,0,1);
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      pvVar2 = pVVar4->pArray[lVar6];
      uVar1 = *(uint *)((long)pvVar2 + 0x14);
      if ((uVar1 & 0xf) - 5 < 0xfffffffe) {
        Cut_OracleComputeCuts
                  (p,*(int *)((long)pvVar2 + 0x10),**(int **)((long)pvVar2 + 0x20),
                   (*(int **)((long)pvVar2 + 0x20))[1],uVar1 >> 10 & 1,uVar1 >> 0xb & 1);
        if (iVar3 != 0) {
          Cut_OracleTryDroppingCuts(p,**(int **)((long)pvVar2 + 0x20));
          piVar5 = (int *)(*(long *)((long)pvVar2 + 0x20) + 4);
LAB_002a21bf:
          Cut_OracleTryDroppingCuts(p,*piVar5);
        }
      }
      else if (iVar3 != 0) {
        piVar5 = *(int **)((long)pvVar2 + 0x20);
        goto LAB_002a21bf;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar4->nSize);
  }
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
    return;
  }
  return;
}

Assistant:

void Abc_NtkCutsOracle( Abc_Ntk_t * pNtk, Cut_Oracle_t * p )
{
    Abc_Obj_t * pObj;
    Vec_Ptr_t * vNodes;
    int i; //, clk = Abc_Clock();
    int fDrop = Cut_OracleReadDrop(p);

    assert( Abc_NtkIsStrash(pNtk) );

    // prepare cut droppping
    if ( fDrop )
        Cut_OracleSetFanoutCounts( p, Abc_NtkFanoutCounts(pNtk) );

    // set cuts for PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 0 )
            Cut_OracleNodeSetTriv( p, pObj->Id );

    // compute cuts for internal nodes
    vNodes = Abc_AigDfs( pNtk, 0, 1 ); // collects POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        // when we reached a CO, it is time to deallocate the cuts
        if ( Abc_ObjIsCo(pObj) )
        {
            if ( fDrop )
                Cut_OracleTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            continue;
        }
        // skip constant node, it has no cuts
//        if ( Abc_NodeIsConst(pObj) )
//            continue;
        // compute the cuts to the internal node
        Cut_OracleComputeCuts( p, pObj->Id, Abc_ObjFaninId0(pObj), Abc_ObjFaninId1(pObj),  
                Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
        // consider dropping the fanins cuts
        if ( fDrop )
        {
            Cut_OracleTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            Cut_OracleTryDroppingCuts( p, Abc_ObjFaninId1(pObj) );
        }
    }
    Vec_PtrFree( vNodes );
//ABC_PRT( "Total", Abc_Clock() - clk );
//Abc_NtkPrintCuts_( p, pNtk, 0 );
}